

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O1

uint16_t __thiscall icu_63::ForwardUTrie2StringIterator::next16(ForwardUTrie2StringIterator *this)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort *puVar4;
  long *plVar5;
  uint16_t *puVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  
  puVar4 = *(ushort **)(this + 0x10);
  *(ushort **)(this + 8) = puVar4;
  if (puVar4 == *(ushort **)(this + 0x20)) {
    *(undefined4 *)(this + 0x18) = 0xffffffff;
    return *(uint16_t *)(*(long *)this + 0x28);
  }
  puVar1 = puVar4 + 1;
  *(ushort **)(this + 0x10) = puVar1;
  uVar2 = *puVar4;
  *(uint *)(this + 0x18) = (uint)uVar2;
  if ((uVar2 & 0xfc00) == 0xd800) {
    if (puVar1 != *(ushort **)(this + 0x20)) {
      uVar3 = *puVar1;
      if ((uVar3 & 0xfc00) == 0xdc00) {
        *(ushort **)(this + 0x10) = puVar4 + 2;
        uVar9 = (uint)uVar2 * 0x400 + (uint)uVar3 + 0xfca02400;
        *(uint *)(this + 0x18) = uVar9;
        plVar5 = *(long **)this;
        lVar8 = *plVar5;
        if ((int)uVar9 < *(int *)((long)plVar5 + 0x2c)) {
          iVar7 = (uVar3 & 0x1f) +
                  (uint)*(ushort *)
                         (lVar8 + (ulong)((uVar9 >> 5 & 0x3f) +
                                         (uint)*(ushort *)
                                                (lVar8 + 0x1040 + (ulong)(uVar9 >> 0xb) * 2)) * 2) *
                  4;
        }
        else {
          iVar7 = (int)plVar5[6];
        }
        puVar6 = (uint16_t *)(lVar8 + (long)iVar7 * 2);
        goto LAB_00310556;
      }
    }
    lVar8 = **(long **)this;
    uVar3 = *(ushort *)(lVar8 + 0x280 + (ulong)(uVar2 >> 5) * 2);
  }
  else {
    lVar8 = **(long **)this;
    uVar3 = *(ushort *)(lVar8 + (ulong)(uVar2 >> 5) * 2);
  }
  puVar6 = (uint16_t *)(lVar8 + (ulong)((uVar2 & 0x1f) + (uint)uVar3 * 4) * 2);
LAB_00310556:
  return *puVar6;
}

Assistant:

uint16_t ForwardUTrie2StringIterator::next16() {
    codePointStart=codePointLimit;
    if(codePointLimit==limit) {
        codePoint=U_SENTINEL;
        return static_cast<uint16_t>(trie->errorValue);
    }
    uint16_t result;
    UTRIE2_U16_NEXT16(trie, codePointLimit, limit, codePoint, result);
    return result;
}